

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O0

void __thiscall
duckdb::roaring::RoaringCompressState::RoaringCompressState
          (RoaringCompressState *this,ColumnDataCheckpointData *checkpoint_data,
          unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>
          *analyze_state_p)

{
  pointer pAVar1;
  RoaringAnalyzeState *this_00;
  CompressionFunction *pCVar2;
  _func_int **in_RSI;
  CompressionState *in_RDI;
  CompressionType compression_type;
  idx_t in_stack_00000038;
  RoaringCompressState *in_stack_00000040;
  unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>
  *in_stack_ffffffffffffff68;
  ContainerMetadataCollection *in_stack_ffffffffffffff70;
  RoaringCompressState *this_01;
  
  pAVar1 = unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>::
           operator->((unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>
                       *)in_stack_ffffffffffffff70);
  CompressionState::CompressionState(in_RDI,&pAVar1->info);
  in_RDI->_vptr_CompressionState = (_func_int **)&PTR__RoaringCompressState_0350eee8;
  this_01 = (RoaringCompressState *)(in_RDI + 1);
  unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>::unique_ptr
            ((unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true> *)
             in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>::operator->
            ((unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true> *)
             in_stack_ffffffffffffff70);
  this_00 = AnalyzeState::Cast<duckdb::roaring::RoaringAnalyzeState>
                      ((AnalyzeState *)in_stack_ffffffffffffff70);
  in_RDI[1].info.block_manager = (BlockManager *)this_00;
  ContainerCompressionState::ContainerCompressionState((ContainerCompressionState *)0xa06a65);
  compression_type = (CompressionType)((ulong)&in_RDI[0x3c].info >> 0x38);
  ContainerMetadataCollection::ContainerMetadataCollection(in_stack_ffffffffffffff70);
  in_RDI[0x42].info.block_manager =
       (BlockManager *)
       ((long)&in_RDI[1].info.block_manager[1].blocks_lock.super___mutex_base._M_mutex + 0x20);
  in_RDI[0x43]._vptr_CompressionState = in_RSI;
  pCVar2 = ColumnDataCheckpointData::GetCompressionFunction
                     ((ColumnDataCheckpointData *)this_00,compression_type);
  in_RDI[0x43].info.block_manager = (BlockManager *)pCVar2;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::unique_ptr
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             0xa06aec);
  BufferHandle::BufferHandle((BufferHandle *)&in_RDI[0x44].info);
  in_RDI[0x47]._vptr_CompressionState = (_func_int **)0x0;
  ColumnDataCheckpointData::GetRowGroup((ColumnDataCheckpointData *)0xa06b21);
  CreateEmptySegment(in_stack_00000040,in_stack_00000038);
  in_RDI[0x47]._vptr_CompressionState = (_func_int **)0x0;
  InitializeContainer(this_01);
  return;
}

Assistant:

RoaringCompressState::RoaringCompressState(ColumnDataCheckpointData &checkpoint_data,
                                           unique_ptr<AnalyzeState> analyze_state_p)
    : CompressionState(analyze_state_p->info), owned_analyze_state(std::move(analyze_state_p)),
      analyze_state(owned_analyze_state->Cast<RoaringAnalyzeState>()), container_state(),
      container_metadata(analyze_state.container_metadata), checkpoint_data(checkpoint_data),
      function(checkpoint_data.GetCompressionFunction(CompressionType::COMPRESSION_ROARING)) {
	CreateEmptySegment(checkpoint_data.GetRowGroup().start);
	total_count = 0;
	InitializeContainer();
}